

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstr.cpp
# Opt level: O3

void __thiscall NaCSTRFunc::Function(NaCSTRFunc *this,NaReal *x,NaReal *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  NaReal NVar13;
  NaReal NVar14;
  double dVar15;
  long *plVar16;
  undefined4 uVar17;
  NaReal NVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (y != (NaReal *)0x0 && x != (NaReal *)0x0) {
    plVar16 = (long *)(**(code **)(*(long *)this + 0x18))();
    dVar15 = (double)(**(code **)(*plVar16 + 8))(plVar16);
    plVar16 = (long *)(**(code **)(*(long *)this + 0x18))(this);
    uVar17 = (**(code **)(*plVar16 + 0x20))(plVar16);
    NVar18 = (this->cur).state[1];
    NVar13 = (this->cur).state[2];
    NVar14 = (this->cur).state[3];
    (this->prev).state[0] = (this->cur).state[0];
    (this->prev).state[1] = NVar18;
    (this->prev).state[4] = (this->cur).state[4];
    (this->prev).state[2] = NVar13;
    (this->prev).state[3] = NVar14;
    dVar1 = *x;
    dVar2 = this->k10;
    dVar7 = exp(-this->E1R / (this->prev).state[3]);
    dVar7 = dVar7 * dVar2;
    dVar2 = this->k20;
    dVar8 = exp(-this->E2R / (this->prev).state[3]);
    dVar8 = dVar8 * dVar2;
    dVar2 = this->V;
    dVar3 = this->drH_1;
    dVar4 = this->drH_2;
    dVar5 = this->q;
    dVar6 = (this->cur).state[1];
    dVar10 = (this->cur).state[2];
    dVar11 = (this->cur).state[3];
    dVar12 = (this->prev).state[0];
    auVar19._0_8_ = dVar5 * (this->c_Av - dVar12);
    auVar19._8_8_ = dVar5 * (this->c_Bv - (this->prev).state[1]);
    auVar20._8_8_ = dVar2;
    auVar20._0_8_ = dVar2;
    auVar20 = divpd(auVar19,auVar20);
    (this->cur).state[0] =
         (dVar12 * -(dVar7 + dVar8) + auVar20._0_8_) * dVar15 + (this->cur).state[0];
    (this->cur).state[1] = (dVar12 * dVar7 + auVar20._8_8_) * dVar15 + dVar6;
    dVar6 = (this->prev).state[4];
    dVar9 = this->A * this->k * ((this->prev).state[3] - dVar6);
    NVar18 = ((dVar12 * dVar2 * (-dVar3 * dVar7 - dVar4 * dVar8) - dVar9) /
              (dVar2 * this->rho * this->Cp) + ((this->T_v - (this->prev).state[3]) * dVar5) / dVar2
             ) * dVar15 + dVar11;
    (this->cur).state[2] =
         (((this->c_Cv - (this->prev).state[2]) * dVar5) / dVar2 + dVar8 * dVar12) * dVar15 + dVar10
    ;
    (this->cur).state[3] = NVar18;
    (this->cur).state[4] =
         (dVar9 / (this->V_c * this->rho_c * this->Cp_c) +
         ((this->T_vc - dVar6) * dVar1) / this->V_c) * dVar15 + (this->cur).state[4];
    if (this->out != (NaDataFile *)0x0) {
      (**(code **)(*(long *)this->out + 0x30))();
      (**(code **)(*(long *)this->out + 0x10))(uVar17,this->out,0);
      (**(code **)(*(long *)this->out + 0x10))((int)*(undefined8 *)&this->cur,this->out,1);
      (**(code **)(*(long *)this->out + 0x10))
                ((int)*(undefined8 *)((long)&this->cur + 8),this->out,2);
      (**(code **)(*(long *)this->out + 0x10))
                ((int)*(undefined8 *)((long)&this->cur + 0x10),this->out,3);
      (**(code **)(*(long *)this->out + 0x10))
                ((int)*(undefined8 *)((long)&this->cur + 0x18),this->out,4);
      (**(code **)(*(long *)this->out + 0x10))
                ((int)*(undefined8 *)((long)&this->cur + 0x20),this->out,5);
      (**(code **)(*(long *)this->out + 0x10))(SUB84(dVar1,0),this->out,6);
      NVar18 = (this->cur).state[3];
    }
    *y = NVar18;
  }
  return;
}

Assistant:

void
NaCSTRFunc::Function (NaReal* x, NaReal* y)
{
    if(NULL == x || NULL == y)
	return;

    NaReal dt = Timer().GetSamplingRate();	// seconds
    NaReal time = Timer().CurrentTime();	// seconds

    prev = cur;

    NaReal	q_c = *x;
    NaReal k1 = k10*exp(-E1R/prev.var.T);
    NaReal k2 = k20*exp(-E2R/prev.var.T);
    NaReal Q = prev.var.c_A*V*(k1*(-drH_1) + k2*(-drH_2));

    cur.var.c_A += dt*((c_Av - prev.var.c_A)*q/V - (k1+k2)*prev.var.c_A);
    cur.var.c_B += dt*((c_Bv - prev.var.c_B)*q/V + k1*prev.var.c_A);
    cur.var.c_C += dt*((c_Cv - prev.var.c_C)*q/V + k2*prev.var.c_A);
    cur.var.T += dt*((T_v - prev.var.T)*q/V
		     + (Q - A*k*(prev.var.T-prev.var.T_c))/(V*rho*Cp));
    cur.var.T_c += dt*((T_vc - prev.var.T_c)*q_c/V_c
		       + A*k*(prev.var.T-prev.var.T_c)/(V_c*rho_c*Cp_c));

    if(NULL != out) {
	out->AppendRecord();
	out->SetValue(time, 0);
	out->SetValue(cur.var.c_A, 1);
	out->SetValue(cur.var.c_B, 2);
	out->SetValue(cur.var.c_C, 3);
	out->SetValue(cur.var.T, 4);
	out->SetValue(cur.var.T_c, 5);
	out->SetValue(q_c, 6);
    }

    *y = cur.var.T;
}